

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_do(connectdata *conn,_Bool *done)

{
  CURLcode result;
  _Bool *done_local;
  connectdata *conn_local;
  
  *done = false;
  conn_local._4_4_ = imap_parse_url_path(conn);
  if ((conn_local._4_4_ == CURLE_OK) &&
     (conn_local._4_4_ = imap_parse_custom_request(conn), conn_local._4_4_ == CURLE_OK)) {
    conn_local._4_4_ = imap_regular_transfer(conn,done);
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode imap_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = imap_parse_url_path(conn);
  if(result)
    return result;

  /* Parse the custom request */
  result = imap_parse_custom_request(conn);
  if(result)
    return result;

  result = imap_regular_transfer(conn, done);

  return result;
}